

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O3

int generate_v3(CBB *cbb,char *str,X509V3_CTX *cnf,CBS_ASN1_TAG tag,int format,int depth)

{
  uint8_t *cbs;
  CBB *cbb_00;
  undefined1 cbs_00 [8];
  byte bVar1;
  int iVar2;
  CBS_ASN1_TAG CVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  OPENSSL_STACK *sk;
  size_t sVar7;
  void *pvVar8;
  size_t sVar9;
  ASN1_INTEGER *a;
  ulong uVar10;
  ASN1_OBJECT *a_00;
  ASN1_BIT_STRING *a_01;
  size_t sVar11;
  uchar *data;
  uint uVar12;
  CBB *pCVar13;
  int line;
  CBB *cbs_01;
  char *str_00;
  long lVar14;
  uint8_t v;
  CBS name;
  CBB child;
  uint local_94;
  byte local_89;
  CBS local_88;
  X509V3_CTX *local_78;
  CBB *local_70;
  undefined1 local_68 [8];
  char *pcStack_60;
  
  uVar10 = (ulong)(uint)depth;
  if (format < 0x33) {
    local_94 = 0;
    local_78 = (X509V3_CTX *)cnf;
    local_70 = cbb;
LAB_00224022:
    do {
      do {
        do {
          do {
            bVar1 = *(byte *)&((CBB *)str)->child;
            cbs_01 = (CBB *)str;
            while ((bVar1 != 0 && (iVar2 = OPENSSL_isspace((uint)bVar1), iVar2 != 0))) {
              bVar1 = *(byte *)((long)&cbs_01->child + 1);
              cbs_01 = (CBB *)((long)&cbs_01->child + 1);
            }
            pcVar6 = strchr((char *)cbs_01,0x2c);
            if (pcVar6 == (char *)0x0) {
LAB_002243b3:
              pcVar6 = strchr((char *)cbs_01,0x3a);
              if (pcVar6 == (char *)0x0) {
                str_00 = (char *)strlen((char *)cbs_01);
                pCVar13 = (CBB *)0x22685d;
              }
              else {
                str_00 = pcVar6 + -(long)cbs_01;
                pCVar13 = (CBB *)(pcVar6 + 1);
              }
              lVar14 = 8;
              goto LAB_002243f4;
            }
            pcStack_60 = pcVar6 + -(long)cbs_01;
            local_68 = (undefined1  [8])cbs_01;
            while ((local_88.data = (uint8_t *)local_68, local_88.len = (size_t)pcStack_60,
                   iVar2 = CBS_get_last_u8(&local_88,&local_89), iVar2 != 0 &&
                   (iVar2 = OPENSSL_isspace((uint)local_89), iVar2 != 0))) {
              local_68 = (undefined1  [8])local_88.data;
              pcStack_60 = (char *)local_88.len;
            }
            iVar2 = CBS_get_until_first((CBS *)local_68,&local_88,':');
            if (iVar2 == 0) {
              local_88.data = (uint8_t *)local_68;
              local_88.len = (size_t)pcStack_60;
              local_68 = (undefined1  [8])0x0;
              pcStack_60 = (char *)0x0;
            }
            else {
              CBS_skip((CBS *)local_68,1);
            }
            sVar7 = local_88.len;
            cbs = local_88.data;
            str = pcVar6 + 1;
            iVar2 = cbs_str_equal((CBS *)local_88.data,(char *)local_88.len);
            if ((iVar2 == 0) && (iVar2 = cbs_str_equal((CBS *)cbs,(char *)sVar7), iVar2 == 0)) {
              iVar2 = cbs_str_equal((CBS *)cbs,(char *)sVar7);
              if ((iVar2 == 0) && (iVar2 = cbs_str_equal((CBS *)cbs,(char *)sVar7), iVar2 == 0)) {
                iVar2 = cbs_str_equal((CBS *)cbs,(char *)sVar7);
                if ((iVar2 == 0) && (iVar2 = cbs_str_equal((CBS *)cbs,(char *)sVar7), iVar2 == 0)) {
                  iVar2 = cbs_str_equal((CBS *)cbs,(char *)sVar7);
                  pCVar13 = local_70;
                  if (iVar2 == 0) {
                    iVar2 = cbs_str_equal((CBS *)cbs,(char *)sVar7);
                    if (iVar2 != 0) {
                      uVar12 = 3;
                      if (local_94 != 0) {
                        uVar12 = local_94;
                      }
                      iVar2 = 1;
                      goto LAB_0022430c;
                    }
                    iVar2 = cbs_str_equal((CBS *)cbs,(char *)sVar7);
                    if (iVar2 == 0) {
                      iVar2 = cbs_str_equal((CBS *)cbs,(char *)sVar7);
                      if (iVar2 == 0) goto LAB_002243b3;
                      uVar4 = local_94 | 0x20000000;
                      uVar12 = 0x20000011;
                    }
                    else {
                      uVar4 = local_94 | 0x20000000;
                      uVar12 = 0x20000010;
                    }
                  }
                  else {
                    uVar12 = 4;
                    uVar4 = local_94;
                  }
                  if (local_94 != 0) {
                    uVar12 = uVar4;
                  }
                }
                else {
                  pCVar13 = local_70;
                  if (local_94 != 0) {
                    iVar2 = 0x83;
                    line = 0xdd;
                    goto LAB_002244a3;
                  }
                  CVar3 = parse_tag((CBS *)local_68);
                  if (CVar3 == 0) {
                    return 0;
                  }
                  uVar12 = CVar3 | 0x20000000;
                }
                iVar2 = 0;
LAB_0022430c:
                iVar2 = generate_wrapped(pCVar13,str,(X509V3_CTX *)local_78,uVar12,iVar2,tag,format)
                ;
                return iVar2;
              }
              if (local_94 != 0) {
                iVar2 = 0x83;
                line = 0xd1;
                goto LAB_002244a3;
              }
              local_94 = parse_tag((CBS *)local_68);
              if (local_94 == 0) {
                return 0;
              }
              goto LAB_00224022;
            }
            pcVar6 = pcStack_60;
            cbs_00 = local_68;
            iVar2 = cbs_str_equal((CBS *)local_68,pcStack_60);
            tag = 1;
          } while (iVar2 != 0);
          iVar2 = cbs_str_equal((CBS *)cbs_00,pcVar6);
          tag = 2;
        } while (iVar2 != 0);
        iVar2 = cbs_str_equal((CBS *)cbs_00,pcVar6);
        tag = 3;
      } while (iVar2 != 0);
      iVar2 = cbs_str_equal((CBS *)cbs_00,pcVar6);
      tag = 4;
    } while (iVar2 != 0);
    iVar2 = 0xb6;
    line = 0xcb;
  }
  else {
    iVar2 = 0x83;
    line = 0x93;
  }
LAB_002244a3:
  ERR_put_error(0xc,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                ,line);
  return 0;
LAB_002243f4:
  iVar2 = cbs_str_equal((CBS *)cbs_01,str_00);
  cbb_00 = local_70;
  if (iVar2 == 0) goto code_r0x00224408;
  uVar12 = *(uint *)((long)&generate_v3::kTypes[0].name + lVar14);
  if (uVar12 != 0) {
    CVar3 = uVar12 & 0x20000000 | local_94;
    if (local_94 == 0) {
      CVar3 = uVar12;
    }
    iVar2 = CBB_add_asn1(local_70,(CBB *)local_68,CVar3);
    if (iVar2 == 0) {
      return 0;
    }
    switch(uVar12) {
    case 1:
      if (tag != 1) {
        iVar2 = 0xa1;
        line = 0x14a;
        goto LAB_002244a3;
      }
      iVar2 = X509V3_bool_from_string((char *)pCVar13,(ASN1_BOOLEAN *)&local_88);
      if (iVar2 == 0) {
        iVar2 = 0x7d;
        line = 0x14f;
        goto LAB_002244a3;
      }
      iVar2 = CBB_add_u8((CBB *)local_68,-((int)local_88.data != 0));
      goto LAB_0022496f;
    case 2:
    case 10:
      if (tag == 1) {
        uVar12 = 0;
        a = s2i_ASN1_INTEGER((X509V3_EXT_METHOD *)0x0,(char *)pCVar13);
        if (a != (ASN1_INTEGER *)0x0) {
          uVar4 = i2c_ASN1_INTEGER(a,(uchar **)0x0);
          if (((0 < (int)uVar4) &&
              (iVar2 = CBB_add_space((CBB *)local_68,&local_88.data,(ulong)uVar4), iVar2 != 0)) &&
             (uVar5 = i2c_ASN1_INTEGER(a,&local_88.data), uVar5 == uVar4)) {
            iVar2 = CBB_flush(local_70);
            uVar12 = (uint)(iVar2 != 0);
          }
          ASN1_INTEGER_free(a);
          return uVar12;
        }
        iVar2 = 0x82;
        line = 0x15d;
      }
      else {
        iVar2 = 0x8b;
        line = 0x158;
      }
      goto LAB_002244a3;
    case 3:
      if (tag == 4) {
        a_01 = ASN1_BIT_STRING_new();
        if (a_01 != (ASN1_BIT_STRING *)0x0) {
          iVar2 = CONF_parse_list((char *)pCVar13,0x2c,1,bitstr_cb,a_01);
          if (iVar2 == 0) {
            uVar12 = 0;
            ERR_put_error(0xc,0,0x97,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                          ,0x1b3);
          }
          else {
            uVar12 = 0;
            uVar4 = i2c_ASN1_BIT_STRING(a_01,(uchar **)0x0);
            if (((0 < (int)uVar4) &&
                (iVar2 = CBB_add_space((CBB *)local_68,&local_88.data,(ulong)uVar4), iVar2 != 0)) &&
               (uVar5 = i2c_ASN1_BIT_STRING(a_01,&local_88.data), uVar5 == uVar4)) {
              iVar2 = CBB_flush(cbb_00);
              uVar12 = (uint)(iVar2 != 0);
            }
          }
          ASN1_BIT_STRING_free(a_01);
          return uVar12;
        }
        return 0;
      }
      iVar2 = CBB_add_u8((CBB *)local_68,'\0');
      if (iVar2 == 0) {
        return 0;
      }
    case 4:
      if (tag != 3) {
        if (tag != 1) {
          iVar2 = 0x7c;
          line = 0x1d9;
          goto LAB_002244a3;
        }
        sVar11 = strlen((char *)pCVar13);
        iVar2 = CBB_add_bytes((CBB *)local_68,(uint8_t *)pCVar13,sVar11);
        goto LAB_0022496f;
      }
      data = x509v3_hex_to_bytes((char *)pCVar13,(size_t *)&local_88);
      if (data != (uchar *)0x0) {
        iVar2 = CBB_add_bytes((CBB *)local_68,data,(size_t)local_88.data);
        if (iVar2 == 0) {
          uVar12 = 0;
        }
        else {
          iVar2 = CBB_flush(cbb_00);
          uVar12 = (uint)(iVar2 != 0);
        }
        OPENSSL_free(data);
        return uVar12;
      }
      iVar2 = 0x80;
      line = 0x1d1;
      goto LAB_002244a3;
    case 5:
      if (*(uchar *)&pCVar13->child == '\0') goto LAB_002248a8;
      iVar2 = 0x85;
      line = 0x143;
      goto LAB_002244a3;
    case 6:
      if (tag == 1) {
        a_00 = OBJ_txt2obj((char *)pCVar13,0);
        if ((a_00 != (ASN1_OBJECT *)0x0) && ((long)a_00->length != 0)) {
          iVar2 = CBB_add_bytes((CBB *)local_68,a_00->data,(long)a_00->length);
          if (iVar2 == 0) {
            uVar12 = 0;
          }
          else {
            iVar2 = CBB_flush(cbb_00);
            uVar12 = (uint)(iVar2 != 0);
          }
          ASN1_OBJECT_free(a_00);
          return uVar12;
        }
        iVar2 = 0x86;
        line = 0x170;
      }
      else {
        iVar2 = 0xa5;
        line = 0x16b;
      }
      goto LAB_002244a3;
    case 7:
    case 8:
    case 9:
    case 0xb:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x15:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
      goto switchD_00224465_caseD_7;
    case 0xc:
    case 0x13:
    case 0x14:
    case 0x16:
    case 0x1c:
    case 0x1e:
      if (tag == 1) {
        iVar2 = 0x1001;
      }
      else {
        if (tag != 2) {
          iVar2 = 0x7f;
          line = 0x199;
          goto LAB_002244a3;
        }
        iVar2 = 0x1000;
      }
      local_88.data = (uint8_t *)0x0;
      uVar10 = ASN1_tag2bit(uVar12);
      iVar2 = ASN1_mbstring_ncopy((ASN1_STRING **)&local_88,(uchar *)pCVar13,-1,iVar2,uVar10,0,
                                  0x10000);
      if (0 < iVar2) {
        iVar2 = CBB_add_bytes((CBB *)local_68,*(uchar **)((long)local_88.data + 8),
                              (long)*(int *)local_88.data);
        if (iVar2 == 0) {
          uVar12 = 0;
        }
        else {
          iVar2 = CBB_flush(local_70);
          uVar12 = (uint)(iVar2 != 0);
        }
        ASN1_STRING_free((ASN1_STRING *)local_88.data);
        return uVar12;
      }
      return 0;
    case 0x17:
    case 0x18:
      if (tag != 1) {
        iVar2 = 0xb0;
        line = 0x17b;
        goto LAB_002244a3;
      }
      local_88.len = strlen((char *)pCVar13);
      local_88.data = (uint8_t *)pCVar13;
      if (uVar12 == 0x17) {
        iVar2 = CBS_parse_utc_time(&local_88,(tm *)0x0,0);
      }
      else {
        iVar2 = CBS_parse_generalized_time(&local_88,(tm *)0x0,0);
      }
      if (iVar2 != 0) {
        sVar11 = strlen((char *)pCVar13);
        iVar2 = CBB_add_bytes((CBB *)local_68,(uint8_t *)pCVar13,sVar11);
        if (iVar2 == 0) {
          return 0;
        }
        goto LAB_00224977;
      }
      iVar2 = 0x8a;
      line = 0x186;
      goto LAB_002244a3;
    }
    if (1 < uVar12 + 0xdffffff0) {
switchD_00224465_caseD_7:
      iVar2 = 0x44;
      line = 0x1fe;
      goto LAB_002244a3;
    }
    if (pcVar6 == (char *)0x0) goto LAB_00224560;
    if (local_78 == (X509V3_CTX *)0x0) {
      iVar2 = 0xaa;
      line = 0x1e0;
      goto LAB_002244a3;
    }
    sk = (OPENSSL_STACK *)X509V3_get_section(local_78,(char *)pCVar13);
    if (sk == (OPENSSL_STACK *)0x0) {
      iVar2 = 0xaa;
      line = 0x1e5;
    }
    else {
      sVar7 = OPENSSL_sk_num(sk);
      if (sVar7 == 0) goto LAB_00224560;
      sVar7 = 0;
      while( true ) {
        pvVar8 = OPENSSL_sk_value(sk,sVar7);
        iVar2 = generate_v3((CBB *)local_68,*(char **)((long)pvVar8 + 0x10),(X509V3_CTX *)local_78,1
                            ,format + 1,(int)uVar10);
        if (iVar2 == 0) {
          return 0;
        }
        sVar9 = CBB_len((CBB *)local_68);
        if (0x10000 < sVar9) break;
        sVar7 = sVar7 + 1;
        sVar9 = OPENSSL_sk_num(sk);
        if (sVar9 <= sVar7) {
LAB_00224560:
          if (uVar12 != 0x20000011) {
LAB_002248a8:
            iVar2 = CBB_flush(cbb_00);
            return iVar2;
          }
          iVar2 = CBB_flush_asn1_set_of((CBB *)local_68);
LAB_0022496f:
          if (iVar2 == 0) {
            return 0;
          }
LAB_00224977:
          iVar2 = CBB_flush(cbb_00);
          return (uint)(iVar2 != 0);
        }
      }
      iVar2 = 0xb1;
      line = 0x1f2;
    }
    goto LAB_002244a3;
  }
  goto LAB_00224487;
code_r0x00224408:
  lVar14 = lVar14 + 0x10;
  if (lVar14 == 0x218) goto LAB_00224487;
  goto LAB_002243f4;
LAB_00224487:
  iVar2 = 0xb9;
  line = 0x135;
  goto LAB_002244a3;
}

Assistant:

static int generate_v3(CBB *cbb, const char *str, const X509V3_CTX *cnf,
                       CBS_ASN1_TAG tag, int format, int depth) {
  assert((tag & CBS_ASN1_CONSTRUCTED) == 0);
  if (depth > ASN1_GEN_MAX_DEPTH) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NESTED_TAGGING);
    return 0;
  }

  // Process modifiers. This function uses a mix of NUL-terminated strings and
  // |CBS|. Several functions only work with NUL-terminated strings, so we need
  // to keep track of when a slice spans the whole buffer.
  for (;;) {
    // Skip whitespace.
    while (*str != '\0' && OPENSSL_isspace((unsigned char)*str)) {
      str++;
    }

    // Modifiers end at commas.
    const char *comma = strchr(str, ',');
    if (comma == NULL) {
      break;
    }

    // Remove trailing whitespace.
    CBS modifier;
    CBS_init(&modifier, (const uint8_t *)str, comma - str);
    for (;;) {
      uint8_t v;
      CBS copy = modifier;
      if (!CBS_get_last_u8(&copy, &v) || !OPENSSL_isspace(v)) {
        break;
      }
      modifier = copy;
    }

    // Advance the string past the modifier, but save the original value. We
    // will need to rewind if this is not a recognized modifier.
    const char *str_old = str;
    str = comma + 1;

    // Each modifier is either NAME:VALUE or NAME.
    CBS name;
    int has_value = CBS_get_until_first(&modifier, &name, ':');
    if (has_value) {
      CBS_skip(&modifier, 1);  // Skip the colon.
    } else {
      name = modifier;
      CBS_init(&modifier, NULL, 0);
    }

    if (cbs_str_equal(&name, "FORMAT") || cbs_str_equal(&name, "FORM")) {
      if (cbs_str_equal(&modifier, "ASCII")) {
        format = ASN1_GEN_FORMAT_ASCII;
      } else if (cbs_str_equal(&modifier, "UTF8")) {
        format = ASN1_GEN_FORMAT_UTF8;
      } else if (cbs_str_equal(&modifier, "HEX")) {
        format = ASN1_GEN_FORMAT_HEX;
      } else if (cbs_str_equal(&modifier, "BITLIST")) {
        format = ASN1_GEN_FORMAT_BITLIST;
      } else {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_FORMAT);
        return 0;
      }
    } else if (cbs_str_equal(&name, "IMP") ||
               cbs_str_equal(&name, "IMPLICIT")) {
      if (tag != 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NESTED_TAGGING);
        return 0;
      }
      tag = parse_tag(&modifier);
      if (tag == 0) {
        return 0;
      }
    } else if (cbs_str_equal(&name, "EXP") ||
               cbs_str_equal(&name, "EXPLICIT")) {
      // It would actually be supportable, but OpenSSL does not allow wrapping
      // an explicit tag in an implicit tag.
      if (tag != 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NESTED_TAGGING);
        return 0;
      }
      tag = parse_tag(&modifier);
      return tag != 0 &&
             generate_wrapped(cbb, str, cnf, tag | CBS_ASN1_CONSTRUCTED,
                              /*padding=*/0, format, depth);
    } else if (cbs_str_equal(&name, "OCTWRAP")) {
      tag = tag == 0 ? CBS_ASN1_OCTETSTRING : tag;
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/0, format, depth);
    } else if (cbs_str_equal(&name, "BITWRAP")) {
      tag = tag == 0 ? CBS_ASN1_BITSTRING : tag;
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/1, format, depth);
    } else if (cbs_str_equal(&name, "SEQWRAP")) {
      tag = tag == 0 ? CBS_ASN1_SEQUENCE : (tag | CBS_ASN1_CONSTRUCTED);
      tag |= CBS_ASN1_CONSTRUCTED;
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/0, format, depth);
    } else if (cbs_str_equal(&name, "SETWRAP")) {
      tag = tag == 0 ? CBS_ASN1_SET : (tag | CBS_ASN1_CONSTRUCTED);
      return generate_wrapped(cbb, str, cnf, tag, /*padding=*/0, format, depth);
    } else {
      // If this was not a recognized modifier, rewind |str| to before splitting
      // on the comma. The type itself consumes all remaining input.
      str = str_old;
      break;
    }
  }

  // The final element is, like modifiers, NAME:VALUE or NAME, but VALUE spans
  // the length of the string, including any commas.
  const char *colon = strchr(str, ':');
  CBS name;
  const char *value;
  int has_value = colon != NULL;
  if (has_value) {
    CBS_init(&name, (const uint8_t *)str, colon - str);
    value = colon + 1;
  } else {
    CBS_init(&name, (const uint8_t *)str, strlen(str));
    value = "";  // Most types treat missing and empty value equivalently.
  }

  static const struct {
    const char *name;
    CBS_ASN1_TAG type;
  } kTypes[] = {
      {"BOOL", CBS_ASN1_BOOLEAN},
      {"BOOLEAN", CBS_ASN1_BOOLEAN},
      {"NULL", CBS_ASN1_NULL},
      {"INT", CBS_ASN1_INTEGER},
      {"INTEGER", CBS_ASN1_INTEGER},
      {"ENUM", CBS_ASN1_ENUMERATED},
      {"ENUMERATED", CBS_ASN1_ENUMERATED},
      {"OID", CBS_ASN1_OBJECT},
      {"OBJECT", CBS_ASN1_OBJECT},
      {"UTCTIME", CBS_ASN1_UTCTIME},
      {"UTC", CBS_ASN1_UTCTIME},
      {"GENERALIZEDTIME", CBS_ASN1_GENERALIZEDTIME},
      {"GENTIME", CBS_ASN1_GENERALIZEDTIME},
      {"OCT", CBS_ASN1_OCTETSTRING},
      {"OCTETSTRING", CBS_ASN1_OCTETSTRING},
      {"BITSTR", CBS_ASN1_BITSTRING},
      {"BITSTRING", CBS_ASN1_BITSTRING},
      {"UNIVERSALSTRING", CBS_ASN1_UNIVERSALSTRING},
      {"UNIV", CBS_ASN1_UNIVERSALSTRING},
      {"IA5", CBS_ASN1_IA5STRING},
      {"IA5STRING", CBS_ASN1_IA5STRING},
      {"UTF8", CBS_ASN1_UTF8STRING},
      {"UTF8String", CBS_ASN1_UTF8STRING},
      {"BMP", CBS_ASN1_BMPSTRING},
      {"BMPSTRING", CBS_ASN1_BMPSTRING},
      {"PRINTABLESTRING", CBS_ASN1_PRINTABLESTRING},
      {"PRINTABLE", CBS_ASN1_PRINTABLESTRING},
      {"T61", CBS_ASN1_T61STRING},
      {"T61STRING", CBS_ASN1_T61STRING},
      {"TELETEXSTRING", CBS_ASN1_T61STRING},
      {"SEQUENCE", CBS_ASN1_SEQUENCE},
      {"SEQ", CBS_ASN1_SEQUENCE},
      {"SET", CBS_ASN1_SET},
  };
  CBS_ASN1_TAG type = 0;
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTypes); i++) {
    if (cbs_str_equal(&name, kTypes[i].name)) {
      type = kTypes[i].type;
      break;
    }
  }
  if (type == 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_UNKNOWN_TAG);
    return 0;
  }

  // If there is an implicit tag, use the constructed bit from the base type.
  tag = tag == 0 ? type : (tag | (type & CBS_ASN1_CONSTRUCTED));
  CBB child;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    return 0;
  }

  switch (type) {
    case CBS_ASN1_NULL:
      if (*value != '\0') {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_NULL_VALUE);
        return 0;
      }
      return CBB_flush(cbb);

    case CBS_ASN1_BOOLEAN: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NOT_ASCII_FORMAT);
        return 0;
      }
      ASN1_BOOLEAN boolean;
      if (!X509V3_bool_from_string(value, &boolean)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_BOOLEAN);
        return 0;
      }
      return CBB_add_u8(&child, boolean ? 0xff : 0x00) && CBB_flush(cbb);
    }

    case CBS_ASN1_INTEGER:
    case CBS_ASN1_ENUMERATED: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_INTEGER_NOT_ASCII_FORMAT);
        return 0;
      }
      ASN1_INTEGER *obj = s2i_ASN1_INTEGER(NULL, value);
      if (obj == NULL) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_INTEGER);
        return 0;
      }
      int len = i2c_ASN1_INTEGER(obj, NULL);
      uint8_t *out;
      int ok = len > 0 &&  //
               CBB_add_space(&child, &out, len) &&
               i2c_ASN1_INTEGER(obj, &out) == len && CBB_flush(cbb);
      ASN1_INTEGER_free(obj);
      return ok;
    }

    case CBS_ASN1_OBJECT: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_OBJECT_NOT_ASCII_FORMAT);
        return 0;
      }
      ASN1_OBJECT *obj = OBJ_txt2obj(value, /*dont_search_names=*/0);
      if (obj == NULL || obj->length == 0) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OBJECT);
        return 0;
      }
      int ok = CBB_add_bytes(&child, obj->data, obj->length) && CBB_flush(cbb);
      ASN1_OBJECT_free(obj);
      return ok;
    }

    case CBS_ASN1_UTCTIME:
    case CBS_ASN1_GENERALIZEDTIME: {
      if (format != ASN1_GEN_FORMAT_ASCII) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_TIME_NOT_ASCII_FORMAT);
        return 0;
      }
      CBS value_cbs;
      CBS_init(&value_cbs, (const uint8_t *)value, strlen(value));
      int ok = type == CBS_ASN1_UTCTIME
                   ? CBS_parse_utc_time(&value_cbs, NULL,
                                        /*allow_timezone_offset=*/0)
                   : CBS_parse_generalized_time(&value_cbs, NULL,
                                                /*allow_timezone_offset=*/0);
      if (!ok) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_TIME_VALUE);
        return 0;
      }
      return CBB_add_bytes(&child, (const uint8_t *)value, strlen(value)) &&
             CBB_flush(cbb);
    }

    case CBS_ASN1_UNIVERSALSTRING:
    case CBS_ASN1_IA5STRING:
    case CBS_ASN1_UTF8STRING:
    case CBS_ASN1_BMPSTRING:
    case CBS_ASN1_PRINTABLESTRING:
    case CBS_ASN1_T61STRING: {
      int encoding;
      if (format == ASN1_GEN_FORMAT_ASCII) {
        encoding = MBSTRING_ASC;
      } else if (format == ASN1_GEN_FORMAT_UTF8) {
        encoding = MBSTRING_UTF8;
      } else {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_FORMAT);
        return 0;
      }

      // |maxsize| is measured in code points, rather than bytes, but pass it in
      // as a loose cap so fuzzers can exit from excessively long inputs
      // earlier. This limit is not load-bearing because |ASN1_mbstring_ncopy|'s
      // output is already linear in the input.
      ASN1_STRING *obj = NULL;
      if (ASN1_mbstring_ncopy(&obj, (const uint8_t *)value, -1, encoding,
                              ASN1_tag2bit(type), /*minsize=*/0,
                              /*maxsize=*/ASN1_GEN_MAX_OUTPUT) <= 0) {
        return 0;
      }
      int ok = CBB_add_bytes(&child, obj->data, obj->length) && CBB_flush(cbb);
      ASN1_STRING_free(obj);
      return ok;
    }

    case CBS_ASN1_BITSTRING:
      if (format == ASN1_GEN_FORMAT_BITLIST) {
        ASN1_BIT_STRING *obj = ASN1_BIT_STRING_new();
        if (obj == NULL) {
          return 0;
        }
        if (!CONF_parse_list(value, ',', 1, bitstr_cb, obj)) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_LIST_ERROR);
          ASN1_BIT_STRING_free(obj);
          return 0;
        }
        int len = i2c_ASN1_BIT_STRING(obj, NULL);
        uint8_t *out;
        int ok = len > 0 &&  //
                 CBB_add_space(&child, &out, len) &&
                 i2c_ASN1_BIT_STRING(obj, &out) == len &&  //
                 CBB_flush(cbb);
        ASN1_BIT_STRING_free(obj);
        return ok;
      }

      // The other formats are the same as OCTET STRING, but with the leading
      // zero bytes.
      if (!CBB_add_u8(&child, 0)) {
        return 0;
      }
      [[fallthrough]];

    case CBS_ASN1_OCTETSTRING:
      if (format == ASN1_GEN_FORMAT_ASCII) {
        return CBB_add_bytes(&child, (const uint8_t *)value, strlen(value)) &&
               CBB_flush(cbb);
      }
      if (format == ASN1_GEN_FORMAT_HEX) {
        size_t len;
        uint8_t *data = x509v3_hex_to_bytes(value, &len);
        if (data == NULL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_HEX);
          return 0;
        }
        int ok = CBB_add_bytes(&child, data, len) && CBB_flush(cbb);
        OPENSSL_free(data);
        return ok;
      }

      OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_BITSTRING_FORMAT);
      return 0;

    case CBS_ASN1_SEQUENCE:
    case CBS_ASN1_SET:
      if (has_value) {
        if (cnf == NULL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_OR_SET_NEEDS_CONFIG);
          return 0;
        }
        const STACK_OF(CONF_VALUE) *section = X509V3_get_section(cnf, value);
        if (section == NULL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_SEQUENCE_OR_SET_NEEDS_CONFIG);
          return 0;
        }
        for (size_t i = 0; i < sk_CONF_VALUE_num(section); i++) {
          const CONF_VALUE *conf = sk_CONF_VALUE_value(section, i);
          if (!generate_v3(&child, conf->value, cnf, /*tag=*/0,
                           ASN1_GEN_FORMAT_ASCII, depth + 1)) {
            return 0;
          }
          // This recursive call, by referencing |section|, is the one place
          // where |generate_v3|'s output can be super-linear in the input.
          // Check bounds here.
          if (CBB_len(&child) > ASN1_GEN_MAX_OUTPUT) {
            OPENSSL_PUT_ERROR(ASN1, ASN1_R_TOO_LONG);
            return 0;
          }
        }
      }
      if (type == CBS_ASN1_SET) {
        // The SET type here is a SET OF and must be sorted.
        return CBB_flush_asn1_set_of(&child) && CBB_flush(cbb);
      }
      return CBB_flush(cbb);

    default:
      OPENSSL_PUT_ERROR(ASN1, ERR_R_INTERNAL_ERROR);
      return 0;
  }
}